

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::LargeHeapBlock::FinishPartialCollect(LargeHeapBlock *this,Recycler *recycler)

{
  LargeObjectHeader *header_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  LargeObjectHeader **ppLVar4;
  uint *address;
  LargeObjectHeader *header;
  uint i;
  Recycler *recycler_local;
  LargeHeapBlock *this_local;
  
  if ((this->hasPartialFreeObjects & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x83b,"(this->hasPartialFreeObjects)","this->hasPartialFreeObjects");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  header._4_4_ = 0;
  do {
    if (this->allocCount <= header._4_4_) {
      this->hasPartialFreeObjects = false;
      return;
    }
    ppLVar4 = HeaderList(this);
    header_00 = ppLVar4[header._4_4_];
    if ((header_00 != (LargeObjectHeader *)0x0) &&
       (bVar2 = IsPartialSweptHeader(this,header_00), bVar2)) {
      address = (uint *)((ulong)header_00 & 0xfffffffffffffffe);
      if (*address != header._4_4_) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                           ,0x843,"(header->objectIndex == i)","header->objectIndex == i");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      ppLVar4 = HeaderList(this);
      ppLVar4[header._4_4_] = (LargeObjectHeader *)0x0;
      FillFreeMemory(this,recycler,address,*(long *)(address + 2) + 0x20);
    }
    header._4_4_ = header._4_4_ + 1;
  } while( true );
}

Assistant:

void
LargeHeapBlock::FinishPartialCollect(Recycler * recycler)
{
    Assert(this->hasPartialFreeObjects);
    for (uint i = 0; i < allocCount; i++)
    {
        LargeObjectHeader * header = this->HeaderList()[i];

        if (header != nullptr && IsPartialSweptHeader(header))
        {
            header = (LargeObjectHeader *)((size_t)header & ~PartialFreeBit);
            Assert(header->objectIndex == i);
            this->HeaderList()[i] = nullptr;
            FillFreeMemory(recycler, header, sizeof(LargeObjectHeader) + header->objectSize);
        }
    }
    DebugOnly(this->hasPartialFreeObjects = false);
}